

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGenerator.h
# Opt level: O0

void generateHeapOrder(int size,int heapNumber,vector<int,_std::allocator<int>_> *order)

{
  result_type rVar1;
  reference pvVar2;
  int local_13a4;
  undefined1 local_13a0 [4];
  int i;
  mt19937 generator;
  vector<int,_std::allocator<int>_> *order_local;
  int heapNumber_local;
  int size_local;
  
  generator._M_p = (size_t)order;
  std::vector<int,_std::allocator<int>_>::resize(order,(long)size);
  rVar1 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_13a0,rVar1);
  for (local_13a4 = 0; local_13a4 < size; local_13a4 = local_13a4 + 1) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_13a0);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)generator._M_p,(long)local_13a4);
    *pvVar2 = (value_type)
              ((rVar1 % (ulong)(long)heapNumber + (long)heapNumber) % (ulong)(long)heapNumber);
  }
  return;
}

Assistant:

void generateHeapOrder(int size, int heapNumber, std::vector<int>& order) {
    order.resize(size);
    std::mt19937 generator(time(0));

    for (int i = 0; i < size; i++)
        order[i] = (generator() % heapNumber + heapNumber) % heapNumber;
}